

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::Cluster::CreateBlockGroup
          (Cluster *this,longlong start_offset,longlong size,longlong discard_padding)

{
  long lVar1;
  longlong lVar2;
  longlong lVar3;
  long lVar4;
  long *plVar5;
  void *idx_00;
  longlong in_RCX;
  long in_RDX;
  long in_RSI;
  BlockGroup *in_RDI;
  long status;
  BlockGroup *p;
  BlockEntry **pEntry;
  BlockEntry **ppEntry;
  long idx;
  long status_1;
  longlong time;
  long size_;
  longlong size_1;
  longlong id;
  long len;
  longlong bsize;
  longlong bpos;
  longlong duration;
  longlong next;
  longlong prev;
  longlong stop;
  longlong pos;
  IMkvReader *pReader;
  longlong in_stack_fffffffffffffef0;
  BlockGroup *in_stack_fffffffffffffef8;
  longlong *in_stack_ffffffffffffff00;
  IMkvReader *in_stack_ffffffffffffff08;
  void *pvVar6;
  IMkvReader *in_stack_ffffffffffffff18;
  longlong in_stack_ffffffffffffff20;
  longlong in_stack_ffffffffffffff28;
  longlong in_stack_ffffffffffffff30;
  long local_78;
  long local_68;
  long local_40;
  
  lVar1 = in_RSI + in_RDX;
  local_68 = -1;
  local_40 = in_RSI;
  do {
    if (lVar1 <= local_40) {
      if (local_68 < 0) {
        return -2;
      }
      if (local_40 != lVar1) {
        return -2;
      }
      plVar5 = (long *)(*(long *)&(in_RDI->m_block).m_timecode +
                       *(long *)&(in_RDI->m_block).m_frame_count * 8);
      idx_00 = operator_new(0x68,(nothrow_t *)&std::nothrow);
      pvVar6 = (void *)0x0;
      if (idx_00 != (void *)0x0) {
        BlockGroup::BlockGroup
                  (in_RDI,(Cluster *)0x0,(long)idx_00,(longlong)in_stack_fffffffffffffef8,
                   in_stack_fffffffffffffef0,in_RCX,in_stack_ffffffffffffff20,
                   in_stack_ffffffffffffff28,in_stack_ffffffffffffff30);
        pvVar6 = idx_00;
      }
      *plVar5 = (long)pvVar6;
      if (*plVar5 == 0) {
        return -1;
      }
      lVar1 = BlockGroup::Parse(in_stack_fffffffffffffef8);
      if (lVar1 == 0) {
        *(long *)&(in_RDI->m_block).m_frame_count = *(long *)&(in_RDI->m_block).m_frame_count + 1;
        return 0;
      }
      if ((long *)*plVar5 != (long *)0x0) {
        (**(code **)(*(long *)*plVar5 + 8))();
      }
      *plVar5 = 0;
      return lVar1;
    }
    lVar2 = ReadID(in_stack_ffffffffffffff18,(longlong)in_RDI,(long *)in_stack_ffffffffffffff08);
    if ((lVar2 < 0) || (lVar1 < local_40 + local_78)) {
      return -2;
    }
    local_40 = local_78 * 2 + local_40;
    lVar3 = ReadUInt(in_stack_ffffffffffffff08,(longlong)in_stack_ffffffffffffff00,
                     (long *)in_stack_fffffffffffffef8);
    if (lVar2 == 0xa1) {
      if (local_68 < 0) {
        local_68 = local_40;
      }
    }
    else if (lVar2 == 0x9b) {
      if (8 < lVar3) {
        return -2;
      }
      lVar2 = UnserializeUInt(in_stack_ffffffffffffff08,(longlong)in_stack_ffffffffffffff00,
                              (longlong)in_stack_fffffffffffffef8);
      if (lVar2 < 0) {
        return -2;
      }
    }
    else if (lVar2 == 0xfb) {
      if ((8 < lVar3) || (lVar3 < 1)) {
        return -2;
      }
      lVar4 = UnserializeInt(in_stack_ffffffffffffff18,(longlong)in_RDI,
                             (longlong)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      if (lVar4 != 0) {
        return -1;
      }
    }
    local_40 = lVar3 + local_40;
    if (lVar1 < local_40) {
      return -2;
    }
  } while( true );
}

Assistant:

long Cluster::CreateBlockGroup(long long start_offset, long long size,
                               long long discard_padding) {
  assert(m_entries);
  assert(m_entries_size > 0);
  assert(m_entries_count >= 0);
  assert(m_entries_count < m_entries_size);

  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long pos = start_offset;
  const long long stop = start_offset + size;

  // For WebM files, there is a bias towards previous reference times
  //(in order to support alt-ref frames, which refer back to the previous
  // keyframe).  Normally a 0 value is not possible, but here we tenatively
  // allow 0 as the value of a reference frame, with the interpretation
  // that this is a "previous" reference time.

  long long prev = 1;  // nonce
  long long next = 0;  // nonce
  long long duration = -1;  // really, this is unsigned

  long long bpos = -1;
  long long bsize = -1;

  while (pos < stop) {
    long len;
    const long long id = ReadID(pReader, pos, len);
    if (id < 0 || (pos + len) > stop)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    assert(size >= 0);  // TODO
    assert((pos + len) <= stop);

    pos += len;  // consume size

    if (id == libwebm::kMkvBlock) {
      if (bpos < 0) {  // Block ID
        bpos = pos;
        bsize = size;
      }
    } else if (id == libwebm::kMkvBlockDuration) {
      if (size > 8)
        return E_FILE_FORMAT_INVALID;

      duration = UnserializeUInt(pReader, pos, size);

      if (duration < 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvReferenceBlock) {
      if (size > 8 || size <= 0)
        return E_FILE_FORMAT_INVALID;
      const long size_ = static_cast<long>(size);

      long long time;

      long status = UnserializeInt(pReader, pos, size_, time);
      assert(status == 0);
      if (status != 0)
        return -1;

      if (time <= 0)  // see note above
        prev = time;
      else
        next = time;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }
  if (bpos < 0)
    return E_FILE_FORMAT_INVALID;

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  assert(bsize >= 0);

  const long idx = m_entries_count;

  BlockEntry** const ppEntry = m_entries + idx;
  BlockEntry*& pEntry = *ppEntry;

  pEntry = new (std::nothrow)
      BlockGroup(this, idx, bpos, bsize, prev, next, duration, discard_padding);

  if (pEntry == NULL)
    return -1;  // generic error

  BlockGroup* const p = static_cast<BlockGroup*>(pEntry);

  const long status = p->Parse();

  if (status == 0) {  // success
    ++m_entries_count;
    return 0;
  }

  delete pEntry;
  pEntry = 0;

  return status;
}